

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

bool __thiscall RenX::Server::updateClientList(Server *this)

{
  list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *plVar1;
  uint uVar2;
  int iVar3;
  rep rVar4;
  _List_node_base *p_Var5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  
  rVar4 = std::chrono::_V2::steady_clock::now();
  (this->m_lastClientListUpdate).__d.__r = rVar4;
  plVar1 = &this->players;
  sVar6 = 0;
  for (p_Var5 = (this->players).
                super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var5 != (_List_node_base *)plVar1;
      p_Var5 = p_Var5->_M_next) {
    sVar6 = sVar6 + *(byte *)&p_Var5[0x11]._M_next;
  }
  if ((this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
      _M_node._M_size == sVar6) {
    bVar9 = false;
  }
  else {
    uVar2 = this->m_rconVersion;
    rVar4 = std::chrono::_V2::steady_clock::now();
    (this->m_lastSendActivity).__d.__r = rVar4;
    pcVar8 = anon_var_dwarf_699e3;
    if (3 < uVar2) {
      pcVar8 = "cclientvarlist ID SCORE CREDITS PING\n";
    }
    iVar3 = Jupiter::Socket::send(&this->m_sock,0x25,pcVar8);
    bVar9 = 0 < iVar3;
  }
  p_Var5 = (plVar1->super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)plVar1) {
    lVar7 = 0;
    do {
      lVar7 = lVar7 + (ulong)*(byte *)&p_Var5[0x11]._M_next;
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)plVar1);
    if (lVar7 != 0) {
      uVar2 = this->m_rconVersion;
      rVar4 = std::chrono::_V2::steady_clock::now();
      (this->m_lastSendActivity).__d.__r = rVar4;
      pcVar8 = anon_var_dwarf_69a05;
      if (3 < uVar2) {
        pcVar8 = "cbotvarlist ID SCORE CREDITS\n";
      }
      iVar3 = Jupiter::Socket::send(&this->m_sock,0x1d,pcVar8);
      bVar9 = (bool)(bVar9 | 0 < iVar3);
    }
  }
  return bVar9;
}

Assistant:

bool RenX::Server::updateClientList() {
	m_lastClientListUpdate = std::chrono::steady_clock::now();

	int result = 0;
	if (this->players.size() != getBotCount()) {
		if (m_rconVersion >= 4)
			result = sendSocket("cclientvarlist ID SCORE CREDITS PING\n"sv) > 0;
		else
			result = sendSocket("cclientvarlist ID\xA0""SCORE\xA0""CREDITS\xA0""PING\n"sv) > 0;
	}

	if (getBotCount() != 0) {
		if (m_rconVersion >= 4)
			result |= sendSocket("cbotvarlist ID SCORE CREDITS\n"sv) > 0;
		else
			result |= sendSocket("cbotvarlist ID\xA0""SCORE\xA0""CREDITS\n"sv) > 0;
	}

	return result != 0;
}